

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t
exr_set_tile_descriptor
          (exr_context_t ctxt,int part_index,uint32_t x_size,uint32_t y_size,
          exr_tile_level_mode_t level_mode,exr_tile_round_mode_t round_mode)

{
  _internal_exr_part *curpart;
  exr_result_t eVar1;
  code *UNRECOVERED_JUMPTABLE;
  exr_attribute_t *peVar2;
  undefined8 uStackY_50;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((-1 < part_index) && (part_index < *(int *)(ctxt + 0xc4))) {
    if (*ctxt == (_priv_exr_context_t)0x3) {
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
      uStackY_50 = 0x15;
    }
    else {
      if (*ctxt != (_priv_exr_context_t)0x0) {
        curpart = *(_internal_exr_part **)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
        if ((curpart->storage_mode & ~EXR_STORAGE_DEEP_SCANLINE) == EXR_STORAGE_SCANLINE) {
          eVar1 = (**(code **)(ctxt + 0x40))
                            (ctxt,0x13,"Attempt to set tile descriptor on scanline part");
          return eVar1;
        }
        peVar2 = curpart->tiles;
        if (peVar2 == (exr_attribute_t *)0x0) {
          eVar1 = exr_attr_list_add(ctxt,&curpart->attributes,"tiles",EXR_ATTR_TILEDESC,0,
                                    (uint8_t **)0x0,&curpart->tiles);
          if (eVar1 != 0) {
            return eVar1;
          }
          peVar2 = curpart->tiles;
        }
        else if (peVar2->type != EXR_ATTR_TILEDESC) {
          eVar1 = (**(code **)(ctxt + 0x48))
                            (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             peVar2->type_name,"tiles",*(code **)(ctxt + 0x48));
          return eVar1;
        }
        ((peVar2->field_6).preview)->width = x_size;
        ((peVar2->field_6).preview)->height = y_size;
        ((peVar2->field_6).tiledesc)->level_and_round =
             (byte)level_mode & 0xf | (byte)(round_mode << 4);
        eVar1 = internal_exr_compute_tile_information((_internal_exr_context *)ctxt,curpart,1);
        return eVar1;
      }
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
      uStackY_50 = 8;
    }
    eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,uStackY_50);
    return eVar1;
  }
  eVar1 = (**(code **)(ctxt + 0x48))
                    (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
  return eVar1;
}

Assistant:

exr_result_t
exr_set_tile_descriptor (
    exr_context_t         ctxt,
    int                   part_index,
    uint32_t              x_size,
    uint32_t              y_size,
    exr_tile_level_mode_t level_mode,
    exr_tile_round_mode_t round_mode)
{
    exr_result_t     rv   = EXR_ERR_SUCCESS;
    exr_attribute_t* attr = NULL;
    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    if (pctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (pctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_ALREADY_WROTE_ATTRS));
    if (part->storage_mode == EXR_STORAGE_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->report_error (
            pctxt,
            EXR_ERR_TILE_SCAN_MIXEDAPI,
            "Attempt to set tile descriptor on scanline part"));

    if (!part->tiles)
    {
        rv = exr_attr_list_add (
            ctxt,
            &(part->attributes),
            "tiles",
            EXR_ATTR_TILEDESC,
            0,
            NULL,
            &(part->tiles));
    }
    else if (part->tiles->type != EXR_ATTR_TILEDESC)
    {
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_FILE_BAD_HEADER,
            "Invalid required attribute type '%s' for '%s'",
            part->tiles->type_name,
            "tiles"));
    }

    attr = part->tiles;

    if (rv == EXR_ERR_SUCCESS)
    {
        attr->tiledesc->x_size = x_size;
        attr->tiledesc->y_size = y_size;
        attr->tiledesc->level_and_round =
            EXR_PACK_TILE_LEVEL_ROUND (level_mode, round_mode);

        rv = internal_exr_compute_tile_information (pctxt, part, 1);
    }

    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}